

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,false,false>
               (dtime_t *ldata,interval_t *rdata,dtime_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  dtime_t left;
  dtime_t left_00;
  dtime_t *pdVar2;
  dtime_t dVar3;
  int64_t *piVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_7c;
  int64_t *local_78;
  dtime_t *local_70;
  undefined4 local_68;
  undefined4 local_64;
  dtime_t *local_60;
  ulong local_58;
  ulong local_50;
  ValidityMask *local_48;
  ulong local_40;
  dtime_t *local_38;
  
  local_48 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &rdata->micros;
      iVar5 = 0;
      do {
        piVar4 = local_78;
        dVar3.micros._0_4_ = ((interval_t *)(local_78 + -1))->months;
        dVar3.micros._4_4_ = ((interval_t *)(local_78 + -1))->days;
        local_64 = 0;
        right_01.micros = (int64_t)&local_64;
        right_01._0_8_ = *local_78;
        dVar3 = Interval::Add((Interval *)ldata[iVar5].micros,dVar3,right_01,(date_t *)mask);
        result_data[iVar5].micros = dVar3.micros;
        iVar5 = iVar5 + 1;
        local_78 = piVar4 + 2;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_78 = &rdata->micros;
    local_40 = 0;
    uVar8 = 0;
    local_70 = result_data;
    local_60 = ldata;
    local_50 = count;
    do {
      pdVar2 = local_60;
      puVar1 = (local_48->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[local_40];
      }
      uVar7 = uVar8 + 0x40;
      if (local_50 <= uVar8 + 0x40) {
        uVar7 = local_50;
      }
      uVar9 = uVar7;
      if (uVar6 != 0) {
        uVar9 = uVar8;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar8 < uVar7) {
            piVar4 = local_78 + uVar8 * 2;
            do {
              left.micros._0_4_ = ((interval_t *)(piVar4 + -1))->months;
              left.micros._4_4_ = ((interval_t *)(piVar4 + -1))->days;
              local_7c = 0;
              right.micros = (int64_t)&local_7c;
              right._0_8_ = *piVar4;
              dVar3 = Interval::Add((Interval *)pdVar2[uVar8].micros,left,right,(date_t *)mask);
              result_data[uVar8].micros = dVar3.micros;
              uVar8 = uVar8 + 1;
              piVar4 = piVar4 + 2;
              uVar9 = uVar8;
            } while (uVar7 != uVar8);
          }
        }
        else {
          result_data = local_70;
          if (uVar8 < uVar7) {
            local_38 = local_70 + uVar8;
            piVar4 = local_78 + uVar8 * 2;
            uVar9 = 0;
            do {
              if ((uVar6 >> (uVar9 & 0x3f) & 1) != 0) {
                left_00.micros._0_4_ = ((interval_t *)(piVar4 + -1))->months;
                left_00.micros._4_4_ = ((interval_t *)(piVar4 + -1))->days;
                local_68 = 0;
                right_00.micros = (int64_t)&local_68;
                right_00._0_8_ = *piVar4;
                dVar3 = Interval::Add((Interval *)pdVar2[uVar8 + uVar9].micros,left_00,right_00,
                                      (date_t *)mask);
                local_38[uVar9].micros = dVar3.micros;
              }
              uVar9 = uVar9 + 1;
              piVar4 = piVar4 + 2;
            } while ((uVar8 - uVar7) + uVar9 != 0);
            uVar9 = uVar8 + uVar9;
            result_data = local_70;
          }
        }
      }
      local_40 = local_40 + 1;
      uVar8 = uVar9;
    } while (local_40 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}